

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

void __thiscall duckdb::Vector::Reinterpret(Vector *this,Vector *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  unsigned_long *puVar1;
  VectorChildBuffer *pVVar2;
  VectorBuffer *pVVar3;
  VectorBuffer *__tmp;
  Vector new_vector;
  undefined1 local_b1;
  VectorChildBuffer *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  LogicalType local_a0;
  Vector local_88;
  
  this->vector_type = other->vector_type;
  if ((this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (other->buffer).internal.
                super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    shared_ptr<duckdb::VectorBuffer,_true>::operator=(&this->buffer,&other->buffer);
  }
  if (this->vector_type == DICTIONARY_VECTOR) {
    LogicalType::LogicalType(&local_a0,&this->type);
    Vector(&local_88,&local_a0,(data_ptr_t)0x0);
    LogicalType::~LogicalType(&local_a0);
    DictionaryVector::VerifyDictionary(other);
    pVVar3 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&other->auxiliary);
    Reinterpret(&local_88,(Vector *)(pVVar3 + 1));
    local_b0 = (VectorChildBuffer *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::VectorChildBuffer,std::allocator<duckdb::VectorChildBuffer>,duckdb::Vector>
              (&local_a8,&local_b0,(allocator<duckdb::VectorChildBuffer> *)&local_b1,&local_88);
    pVVar2 = local_b0;
    if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a8._M_pi)->_M_use_count = (local_a8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a8._M_pi)->_M_use_count = (local_a8._M_pi)->_M_use_count + 1;
      }
    }
    if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
    }
    (this->auxiliary).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = &pVVar2->super_VectorBuffer;
    this_00 = (this->auxiliary).internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (this->auxiliary).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_a8._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (local_88.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_88.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_88.type);
  }
  else if ((this->auxiliary).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (other->auxiliary).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    shared_ptr<duckdb::VectorBuffer,_true>::operator=(&this->auxiliary,&other->auxiliary);
  }
  puVar1 = (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  this->data = other->data;
  (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar1;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            (&(this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
             &(other->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
  (this->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
       (other->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
  return;
}

Assistant:

void Vector::Reinterpret(const Vector &other) {
	vector_type = other.vector_type;
#ifdef DEBUG
	auto &this_type = GetType();
	auto &other_type = other.GetType();

	auto type_is_same = other_type == this_type;
	bool this_is_nested = this_type.IsNested();
	bool other_is_nested = other_type.IsNested();

	bool not_nested = this_is_nested == false && other_is_nested == false;
	bool type_size_equal = GetTypeIdSize(this_type.InternalType()) == GetTypeIdSize(other_type.InternalType());
	//! Either the types are completely identical, or they are not nested and their physical type size is the same
	//! The reason nested types are not allowed is because copying the auxiliary buffer does not happen recursively
	//! e.g DOUBLE[] to BIGINT[], the type of the LIST would say BIGINT but the child Vector says DOUBLE
	D_ASSERT((not_nested && type_size_equal) || type_is_same);
#endif
	AssignSharedPointer(buffer, other.buffer);
	if (vector_type == VectorType::DICTIONARY_VECTOR) {
		Vector new_vector(GetType(), nullptr);
		new_vector.Reinterpret(DictionaryVector::Child(other));
		auxiliary = make_shared_ptr<VectorChildBuffer>(std::move(new_vector));
	} else {
		AssignSharedPointer(auxiliary, other.auxiliary);
	}
	data = other.data;
	validity = other.validity;
}